

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorTiledHorizontal::GenerateElementData
          (DecoratorTiledHorizontal *this,Element *element,BoxArea paint_area)

{
  undefined1 *this_00;
  undefined1 *this_01;
  undefined1 *this_02;
  Vector2f surface_origin;
  Vector2f surface_origin_00;
  Vector2f surface_dimensions;
  Vector2f surface_origin_01;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledHorizontalData *this_03;
  RenderManager *mesh_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float minimum_width;
  float fVar5;
  Texture texture;
  Vector2f right_dimensions;
  Vector2f left_dimensions;
  Vector2f centre_dimensions;
  float local_178;
  float fStack_174;
  Mesh mesh [3];
  RenderBox render_box;
  
  this_00 = &this->field_0x30;
  for (lVar3 = 0x30; lVar3 != 0x114; lVar3 = lVar3 + 0x4c) {
    texture = Decorator::GetTexture
                        ((Decorator *)this,
                         *(int *)((long)&(this->super_DecoratorTiled).super_Decorator.
                                         _vptr_Decorator + lVar3));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar3)
               ,texture);
  }
  Element::GetRenderBox(&render_box,element,paint_area,0);
  left_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element);
  this_01 = &this->field_0x7c;
  right_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_01,element);
  this_02 = &this->field_0xc8;
  centre_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_02,element);
  fStack_174 = render_box.fill_size.y;
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&left_dimensions,fStack_174,Vertical);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&right_dimensions,fStack_174,Vertical);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&centre_dimensions,fStack_174,Vertical);
  fVar4 = Math::Round(left_dimensions.x);
  left_dimensions.x = fVar4;
  fVar4 = Math::Round(right_dimensions.x);
  local_178 = render_box.fill_size.x;
  fVar5 = fVar4 + left_dimensions.x;
  if (local_178 < fVar5) {
    left_dimensions.x = (left_dimensions.x / fVar5) * local_178;
    fVar4 = (fVar4 / fVar5) * local_178;
  }
  right_dimensions.x = fVar4;
  computed = Element::GetComputedValues(element);
  memset(mesh,0,0x90);
  surface_origin_01.y = render_box.border_widths._M_elems[0];
  surface_origin_01.x = render_box.border_widths._M_elems[3];
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_00,mesh + *(int *)this_00,computed,surface_origin_01,left_dimensions,
             left_dimensions);
  surface_origin.y = render_box.border_widths._M_elems[0] + 0.0;
  surface_origin.x = render_box.border_widths._M_elems[3] + left_dimensions.x;
  surface_dimensions.y = centre_dimensions.y;
  surface_dimensions.x = local_178 - (left_dimensions.x + right_dimensions.x);
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_02,mesh + *(int *)this_02,computed,surface_origin,surface_dimensions,
             centre_dimensions);
  surface_origin_00.y = render_box.border_widths._M_elems[0] + 0.0;
  surface_origin_00.x = (local_178 - right_dimensions.x) + render_box.border_widths._M_elems[3];
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_01,mesh + *(int *)this_01,computed,surface_origin_00,right_dimensions,
             right_dimensions);
  num_textures = Decorator::GetNumTextures((Decorator *)this);
  this_03 = (DecoratorTiledHorizontalData *)operator_new(0x10);
  DecoratorTiledHorizontalData::DecoratorTiledHorizontalData(this_03,num_textures);
  mesh_00 = Element::GetRenderManager(element);
  uVar1 = 0;
  uVar2 = (ulong)num_textures;
  if ((int)num_textures < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    RenderManager::MakeGeometry((RenderManager *)&stack0xfffffffffffffef8,(Mesh *)mesh_00);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)((long)&(this_03->geometry->
                           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                           ).render_manager + uVar1),
                (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)&stack0xfffffffffffffef8);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)&stack0xfffffffffffffef8);
  }
  lVar3 = 0x60;
  do {
    Mesh::~Mesh((Mesh *)((long)&mesh[0].vertices.
                                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x30);
  return (DecoratorDataHandle)this_03;
}

Assistant:

DecoratorDataHandle DecoratorTiledHorizontal::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tiles for this element.
	for (int i = 0; i < 3; i++)
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector2f left_dimensions = tiles[LEFT].GetNaturalDimensions(element);
	Vector2f right_dimensions = tiles[RIGHT].GetNaturalDimensions(element);
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);

	// Scale the tile sizes by the height scale.
	ScaleTileDimensions(left_dimensions, size.y, Axis::Vertical);
	ScaleTileDimensions(right_dimensions, size.y, Axis::Vertical);
	ScaleTileDimensions(centre_dimensions, size.y, Axis::Vertical);

	// Round the outer tile widths now so that we don't get gaps when rounding again in GenerateGeometry.
	left_dimensions.x = Math::Round(left_dimensions.x);
	right_dimensions.x = Math::Round(right_dimensions.x);

	// Shrink the x-sizes on the left and right tiles if necessary.
	if (size.x < left_dimensions.x + right_dimensions.x)
	{
		float minimum_width = left_dimensions.x + right_dimensions.x;
		left_dimensions.x = size.x * (left_dimensions.x / minimum_width);
		right_dimensions.x = size.x * (right_dimensions.x / minimum_width);
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	tiles[LEFT].GenerateGeometry(mesh[tiles[LEFT].texture_index], computed, offset, left_dimensions, left_dimensions);

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(left_dimensions.x, 0),
		Vector2f(size.x - (left_dimensions.x + right_dimensions.x), centre_dimensions.y), centre_dimensions);

	tiles[RIGHT].GenerateGeometry(mesh[tiles[RIGHT].texture_index], computed, offset + Vector2f(size.x - right_dimensions.x, 0), right_dimensions,
		right_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledHorizontalData* data = new DecoratorTiledHorizontalData(num_textures);
	RenderManager* render_manager = element->GetRenderManager();

	// Set the mesh and textures on the geometry.
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}